

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

ostream * tcu::operator<<(ostream *os,Interval *interval)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  double dVar4;
  Interval *interval_local;
  ostream *os_local;
  
  bVar1 = Interval::empty(interval);
  if (bVar1) {
    bVar1 = Interval::hasNaN(interval);
    if (bVar1) {
      std::operator<<(os,"[NaN]");
    }
    else {
      std::operator<<(os,"()");
    }
  }
  else {
    bVar1 = Interval::hasNaN(interval);
    pcVar3 = "";
    if (bVar1) {
      pcVar3 = "~";
    }
    poVar2 = std::operator<<(os,pcVar3);
    poVar2 = std::operator<<(poVar2,"[");
    dVar4 = Interval::lo(interval);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    poVar2 = std::operator<<(poVar2,", ");
    dVar4 = Interval::hi(interval);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    std::operator<<(poVar2,"]");
  }
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, const Interval& interval)
{
	if (interval.empty())
		if (interval.hasNaN())
			os << "[NaN]";
		else
			os << "()";
	else
		os << (interval.hasNaN() ? "~" : "")
		   << "[" << interval.lo() << ", " << interval.hi() << "]";
	return os;
}